

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,int *value)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  iterator end_00;
  int *data;
  size_type sVar1;
  size_t sVar2;
  runtime_error *prVar3;
  ulong uVar4;
  size_type __n;
  ulong dimension;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  size_t x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  View<int,_false,_std::allocator<unsigned_long>_> view2;
  View<int,_false,_std::allocator<unsigned_long>_> viewT;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_178;
  iterator iStack_170;
  unsigned_long *local_168;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_140;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  View<int,_true,_std::allocator<unsigned_long>_> local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  View<int,_false,_std::allocator<unsigned_long>_> local_b0;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] == (Marray<int,std::allocator<unsigned_long>>)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Assertion failed.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_178._M_current = (unsigned_long *)0x0;
  iStack_170._M_current = (unsigned_long *)0x0;
  local_168 = (unsigned_long *)0x0;
  local_160._M_current = end._M_current;
  local_128._M_current = begin._M_current;
  if (begin._M_current == end._M_current) {
    __n = 1;
  }
  else {
    __n = 1;
    do {
      local_120.data_ = (pointer)*begin._M_current;
      if (local_120.data_ == (pointer)0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Assertion failed.");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (iStack_170._M_current == local_168) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_178,iStack_170,
                   (unsigned_long *)&local_120);
      }
      else {
        *iStack_170._M_current = (unsigned_long)local_120.data_;
        iStack_170._M_current = iStack_170._M_current + 1;
      }
      __n = __n * (long)local_120.data_;
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != local_160._M_current);
  }
  data = __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
  if (__n != 0) {
    sVar1 = 0;
    do {
      data[sVar1] = *value;
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  if (*(int **)this != (int *)0x0) {
    if ((__n != 1) && (*(size_type *)(this + 0x28) != 0)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_c8,*(size_type *)(this + 0x28),(allocator_type *)&local_120);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_e0,(long)iStack_170._M_current - (long)local_178._M_current >> 3,
                 (allocator_type *)&local_120);
      if (*(long *)this == 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Assertion failed.");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_120.data_ = (pointer)0x1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_140,*(size_type *)(this + 0x28),(value_type *)&local_120,
                 (allocator_type *)local_70);
      local_120.data_ = (pointer)0x1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_158,(long)iStack_170._M_current - (long)local_178._M_current >> 3,
                 (value_type *)&local_120,(allocator_type *)local_70);
      if (*(long *)this != 0) {
        dimension = 0;
        do {
          uVar4 = (long)iStack_170._M_current - (long)local_178._M_current >> 3;
          if (*(ulong *)(this + 0x28) <= uVar4) {
            uVar4 = *(ulong *)(this + 0x28);
          }
          if (uVar4 <= dimension) {
            local_120.data_ = (pointer)0x0;
            local_120.geometry_.shape_ = (size_t *)0x0;
            local_120.geometry_.shapeStrides_ = (size_t *)0x0;
            local_120.geometry_.strides_ = (size_t *)0x0;
            local_120.geometry_.dimension_ = 0;
            local_120.geometry_.size_ = 0;
            local_120.geometry_.coordinateOrder_ = LastMajorOrder;
            local_120.geometry_.isSimple_ = true;
            View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_120);
            View<int,false,std::allocator<unsigned_long>>::
            constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((View<int,false,std::allocator<unsigned_long>> *)this,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_120);
            end_00._M_current = iStack_170._M_current;
            begin_00._M_current = local_178._M_current;
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
            local_70._0_8_ = data;
            marray_detail::Geometry<std::allocator<unsigned_long>>::
            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),begin_00,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )end_00._M_current,(CoordinateOrder *)(this + 0x38),
                       (CoordinateOrder *)(this + 0x38),(allocator_type *)&local_b0);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
            local_b0.data_ = (pointer)0x0;
            local_b0.geometry_.shape_ = (size_t *)0x0;
            local_b0.geometry_.shapeStrides_ = (size_t *)0x0;
            local_b0.geometry_.strides_ = (size_t *)0x0;
            local_b0.geometry_.dimension_ = 0;
            local_b0.geometry_.size_ = 0;
            local_b0.geometry_.coordinateOrder_ = LastMajorOrder;
            local_b0.geometry_.isSimple_ = true;
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_b0);
            View<int,false,std::allocator<unsigned_long>>::
            view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((View<int,false,std::allocator<unsigned_long>> *)local_70,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_b0);
            View<int,_true,_std::allocator<unsigned_long>_>::squeeze(&local_120);
            View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&local_b0);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_b0);
            marray_detail::
            AssignmentOperatorHelper<false,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::execute(&local_120,&local_b0);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_b0);
            operator_delete(local_b0.geometry_.shape_,local_b0.geometry_.dimension_ * 0x18);
            operator_delete(local_60,local_48 * 0x18);
            operator_delete(local_120.geometry_.shape_,local_120.geometry_.dimension_ * 0x18);
            if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_158.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_158.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_158.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_140.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_140.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_140.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_0023167c;
          }
          sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,dimension);
          if (local_178._M_current[dimension] < sVar2) {
            sVar2 = local_178._M_current[dimension];
          }
          local_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[dimension] = sVar2;
          local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[dimension] = sVar2;
          dimension = dimension + 1;
        } while (*(long *)this != 0);
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Assertion failed.");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *data = **(int **)this;
LAB_0023167c:
    operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
    *(undefined8 *)this = 0;
  }
  View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)this,local_128,local_160,data,
             (CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
             (allocator_type *)&local_120);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] == (Marray<int,std::allocator<unsigned_long>>)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Assertion failed.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_178._M_current != (unsigned_long *)0x0) {
    operator_delete(local_178._M_current,(long)local_168 - (long)local_178._M_current);
  }
  return;
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}